

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void SobelRow_C(uint8_t *src_sobelx,uint8_t *src_sobely,uint8_t *dst_argb,int width)

{
  undefined1 uVar1;
  int32_t iVar2;
  int in_ECX;
  undefined1 *in_RDX;
  long in_RSI;
  long in_RDI;
  int s;
  int b;
  int r;
  int i;
  int local_20;
  undefined1 *local_18;
  
  local_18 = in_RDX;
  for (local_20 = 0; local_20 < in_ECX; local_20 = local_20 + 1) {
    iVar2 = libyuv::clamp255((uint)*(byte *)(in_RDI + local_20) + (uint)*(byte *)(in_RSI + local_20)
                            );
    uVar1 = (undefined1)iVar2;
    *local_18 = uVar1;
    local_18[1] = uVar1;
    local_18[2] = uVar1;
    local_18[3] = 0xff;
    local_18 = local_18 + 4;
  }
  return;
}

Assistant:

void SobelRow_C(const uint8_t* src_sobelx,
                const uint8_t* src_sobely,
                uint8_t* dst_argb,
                int width) {
  int i;
  for (i = 0; i < width; ++i) {
    int r = src_sobelx[i];
    int b = src_sobely[i];
    int s = clamp255(r + b);
    dst_argb[0] = (uint8_t)(s);
    dst_argb[1] = (uint8_t)(s);
    dst_argb[2] = (uint8_t)(s);
    dst_argb[3] = (uint8_t)(255u);
    dst_argb += 4;
  }
}